

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

ly_bool troc_modi_parent(trt_tree_ctx *tc)

{
  bool bVar1;
  trt_tree_ctx *tc_local;
  
  if ((tc != (trt_tree_ctx *)0x0) && (tc->cn != (lysc_node *)0x0)) {
    bVar1 = tc->cn->parent != (lysc_node *)0x0;
    if (bVar1) {
      tc->cn = tc->cn->parent;
    }
    return bVar1;
  }
  __assert_fail("tc && tc->cn",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xd20,"ly_bool troc_modi_parent(struct trt_tree_ctx *)");
}

Assistant:

static ly_bool
troc_modi_parent(struct trt_tree_ctx *tc)
{
    assert(tc && tc->cn);
    /* If no parent exists, stay in actual node. */
    if (tc->cn->parent) {
        tc->cn = tc->cn->parent;
        return 1;
    } else {
        return 0;
    }
}